

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O0

void anon_unknown.dwarf_6260c::test_copy_construction<unsigned_long>(void)

{
  bool bVar1;
  ResultBuilder *pRVar2;
  ExpressionLhs<const_unsigned_long_&> EVar3;
  value_type_conflict7 local_628;
  value_type_conflict7 local_620;
  ExpressionLhs<const_unsigned_long_&> local_618;
  SourceLineInfo local_608;
  undefined1 local_5e0 [8];
  ResultBuilder __catchResult_1;
  value_type_conflict7 local_338;
  ExpressionLhs<const_unsigned_long_&> local_330 [2];
  SourceLineInfo local_310;
  undefined1 local_2e8 [8];
  ResultBuilder __catchResult;
  rational r2_1;
  rational r1_1;
  rational r2;
  rational r1;
  
  tcb::rational<unsigned_long>::rational((rational<unsigned_long> *)&r2_1.denom_,3,2);
  __catchResult.m_shouldDebugBreak = (bool)(undefined1)r2_1.denom_;
  __catchResult.m_shouldThrow = (bool)r2_1.denom_._1_1_;
  __catchResult._666_6_ = r2_1.denom_._2_6_;
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_310,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x4b);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2e8,"REQUIRE",&local_310,"r2.num() == r1.num()",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_310);
    local_338 = tcb::rational<unsigned_long>::num
                          ((rational<unsigned_long> *)&__catchResult.m_shouldDebugBreak);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_2e8,&local_338);
    local_330[0] = EVar3;
    __catchResult_1._664_8_ =
         tcb::rational<unsigned_long>::num((rational<unsigned_long> *)&r2_1.denom_);
    pRVar2 = Catch::ExpressionLhs<unsigned_long_const&>::operator==
                       ((ExpressionLhs<unsigned_long_const&> *)local_330,
                        (unsigned_long *)&__catchResult_1.m_shouldDebugBreak);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2e8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2e8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2e8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_608,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x4c);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_5e0,"REQUIRE",&local_608,"r2.denom() == r1.denom()",Normal,"")
    ;
    Catch::SourceLineInfo::~SourceLineInfo(&local_608);
    local_620 = tcb::rational<unsigned_long>::denom
                          ((rational<unsigned_long> *)&__catchResult.m_shouldDebugBreak);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_5e0,&local_620);
    local_618 = EVar3;
    local_628 = tcb::rational<unsigned_long>::denom((rational<unsigned_long> *)&r2_1.denom_);
    pRVar2 = Catch::ExpressionLhs<unsigned_long_const&>::operator==
                       ((ExpressionLhs<unsigned_long_const&> *)&local_618,&local_628);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_5e0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_5e0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_5e0);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

void test_copy_construction()
{
    using rational = tcb::rational<T>;
    
#ifdef TCB_HAVE_CONSTEXPR14
	{
		constexpr rational r1{3, 2};
        constexpr rational r2{r1};
        static_assert(r2.num() == r1.num(), "");
        static_assert(r2.denom() == r1.denom(), "");
    }
#endif

    {
		const rational r1{3, 2};
        const rational r2{r1};
        REQUIRE(r2.num() == r1.num());
        REQUIRE(r2.denom() == r1.denom());
    }
}